

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

void loguru::install_signal_handlers(void)

{
  int iVar1;
  Signal *s;
  Signal *__end1;
  Signal *__begin1;
  Signal (*__range1) [7];
  sigaction sig_action;
  
  memset(&__range1,0,0x98);
  sigemptyset((sigset_t *)&sig_action);
  sig_action.sa_mask.__val[0xf]._0_4_ = (uint)sig_action.sa_mask.__val[0xf] | 4;
  __range1 = (Signal (*) [7])signal_handler;
  __end1 = (Signal *)&ALL_SIGNALS;
  while( true ) {
    if (__end1 == (Signal *)
                  &std::thread::
                   _State_impl<std::thread::_Invoker<std::tuple<loguru::log_message(int,loguru::Message&,bool,bool)::$_0>>>
                   ::vtable) {
      return;
    }
    iVar1 = sigaction(__end1->number,(sigaction *)&__range1,(sigaction *)0x0);
    if (iVar1 == -1) break;
    __end1 = __end1 + 1;
  }
  log_and_abort(0,"CHECK FAILED:  sigaction(s.number, &sig_action, NULL) != -1  ",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/lscpp/external/loguru/loguru.cpp"
                ,0x6fb,"Failed to install handler for %s",__end1->name);
}

Assistant:

void install_signal_handlers()
	{
		struct sigaction sig_action;
		memset(&sig_action, 0, sizeof(sig_action));
		sigemptyset(&sig_action.sa_mask);
		sig_action.sa_flags |= SA_SIGINFO;
		sig_action.sa_sigaction = &signal_handler;
		for (const auto& s : ALL_SIGNALS) {
			CHECK_F(sigaction(s.number, &sig_action, NULL) != -1,
				"Failed to install handler for %s", s.name);
		}
	}